

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int vflag;
  unsigned_long _zzq_args [6];
  secp256k1_ge add;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  uint64_t local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  undefined8 local_40;
  int local_38;
  
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  memcpy(r,&ctx->initial,0x98);
  uVar5 = ctx->blind + *gn;
  local_38 = 0;
  lVar7 = 0x133110;
  uVar3 = 0;
  do {
    uVar6 = (ulong)(uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc) >> ((char)uVar3 * '\x04' & 0x1fU));
    if (7 < uVar3) {
      uVar6 = 0;
    }
    lVar4 = 0;
    do {
      bVar8 = uVar6 * 0x40 == lVar4;
      lVar2 = (long)(int)(uint)bVar8;
      lVar1 = lVar2 + -1;
      lVar2 = -lVar2;
      auVar9._8_4_ = (int)lVar1;
      auVar9._0_8_ = lVar1;
      auVar9._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._8_4_ = (int)lVar2;
      auVar11._0_8_ = lVar2;
      auVar11._12_4_ = (int)((ulong)lVar2 >> 0x20);
      local_d8 = *(undefined1 (*) [16])(lVar7 + -0x30 + lVar4) & auVar11 | local_d8 & auVar9;
      local_c8 = auVar11 & *(undefined1 (*) [16])(lVar7 + -0x20 + lVar4) | auVar9 & local_c8;
      lVar2 = (long)(int)(uint)bVar8;
      lVar1 = lVar2 + -1;
      lVar2 = -lVar2;
      auVar10._8_4_ = (int)lVar1;
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._8_4_ = (int)lVar2;
      auVar12._0_8_ = lVar2;
      auVar12._12_4_ = (int)((ulong)lVar2 >> 0x20);
      local_b8 = *(undefined1 (*) [16])(lVar7 + -0x10 + lVar4) & auVar12 | local_b8 & auVar10;
      local_a8 = auVar12 & *(undefined1 (*) [16])(lVar7 + lVar4) | auVar10 & local_a8;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x400);
    secp256k1_ge_from_storage((secp256k1_ge *)local_98,(secp256k1_ge_storage *)local_d8);
    secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_98);
    uVar3 = uVar3 + 1;
    lVar7 = lVar7 + 0x400;
  } while (uVar3 != 0x40);
  local_38 = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 1;
  local_98._0_16_ = (undefined1  [16])0x0;
  local_98._16_16_ = (undefined1  [16])0x0;
  local_78 = 0;
  secp256k1_fe_verify((secp256k1_fe *)local_98);
  local_40._0_4_ = 0;
  local_40._4_4_ = 1;
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  secp256k1_fe_verify((secp256k1_fe *)local_68);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    int bits = ECMULT_GEN_PREC_BITS;
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int i, j, n_i;
    
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (i = 0; i < n; i++) {
        n_i = secp256k1_scalar_get_bits(&gnb, i * bits, bits);
        for (j = 0; j < g; j++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (https://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &secp256k1_ecmult_gen_prec_table[i][j], j == n_i);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    n_i = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}